

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_geometry.cpp
# Opt level: O3

ON_ModelGeometryComponent * __thiscall
ON_ModelGeometryComponent::operator=(ON_ModelGeometryComponent *this,ON_ModelGeometryComponent *src)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Type TVar2;
  
  if (this != src) {
    ON_ModelComponent::operator=(&this->super_ON_ModelComponent,&src->super_ON_ModelComponent);
    p_Var1 = (this->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (this->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (src->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(src->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var1 = (this->m_attributes_sp).
             super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_attributes_sp).super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->m_attributes_sp).super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (this->m_attributes_sp).super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (src->m_attributes_sp).
             super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_attributes_sp).
                super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(src->m_attributes_sp).
                super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    TVar2 = ON_ModelComponent::ComponentType(&src->super_ON_ModelComponent);
    TVar2 = Internal_ON_ModelGeometry_TypeFilter(TVar2);
    ON_ModelComponent::SetComponentType(&this->super_ON_ModelComponent,TVar2);
  }
  return this;
}

Assistant:

ON_ModelGeometryComponent& ON_ModelGeometryComponent::operator=(const ON_ModelGeometryComponent& src)
{
  if ( this != &src )
  {
    ON_ModelComponent::operator=(src);
    m_geometry_sp.reset();
    m_geometry_sp = src.m_geometry_sp;
    m_attributes_sp.reset();
    m_attributes_sp = src.m_attributes_sp;
    SetComponentType(Internal_ON_ModelGeometry_TypeFilter(src.ComponentType()));
  }
  return *this;
}